

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_ransac.cpp
# Opt level: O1

int main(void)

{
  initializer_list<Point2D> __l;
  double best_error;
  LineModel best_model;
  vector<Point2D,_std::allocator<Point2D>_> Point_sets;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> best_consensus_set;
  double local_90;
  LineModel local_88;
  vector<Point2D,_std::allocator<Point2D>_> local_70;
  undefined1 local_58 [8];
  double local_50;
  _Base_ptr local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  size_t local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_58 = (undefined1  [8])0x4008000000000000;
  local_50 = 4.0;
  local_48 = (_Base_ptr)0x4018000000000000;
  local_40 = (_Base_ptr)0x4020000000000000;
  local_38 = (_Base_ptr)0x4022000000000000;
  local_30 = 0x4028000000000000;
  local_28 = 0x402e000000000000;
  local_20 = 0x4034000000000000;
  local_18 = 0x4024000000000000;
  local_10 = 0xc024000000000000;
  __l._M_len = 5;
  __l._M_array = (iterator)local_58;
  std::vector<Point2D,_std::allocator<Point2D>_>::vector(&local_70,__l,(allocator_type *)&local_88);
  local_40 = (_Base_ptr)&local_50;
  local_50 = (double)((ulong)local_50 & 0xffffffff00000000);
  local_48 = (_Base_ptr)0x0;
  local_30 = 0;
  local_38 = local_40;
  runRansac(&local_70,2,0x32,0.01,
            (int)((double)(int)((ulong)((long)local_70.
                                              super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_70.
                                             super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 4) * 0.5),
            &local_88,
            (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)local_58
            ,&local_90);
  LineModel::printLineParam(&local_88);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *)local_58);
  if (local_70.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {

	vector<Point2D> Point_sets{ Point2D(3, 4), Point2D(6, 8), Point2D(9, 12), Point2D(15, 20), Point2D(10,-10) };
        //vector<Point2D> Point_sets{ Point2D(3, 4), Point2D(3, 7), Point2D(10,-10) };
        //vector<Point2D> Point_sets{ Point2D(3, 4), Point2D(6, 4), Point2D(9, 4), Point2D(15, 4), Point2D(10,-10) };
	int data_size = Point_sets.size();
	//2.设置输入量
	int maxIterations = 50;   //最大迭代次数
	int n = 2;                //模型自由度
	double t = 0.01;        //用于决定数据是否适应于模型的阀值
	int d = data_size * 0.5; //判定模型是否适用于数据集的数据数目
	//3.初始化输出量
	LineModel best_model;            //最佳线性模型
	set<size_t> best_consensus_set;  //记录一致点索引的set
	double best_error;              //最小残差
	//4.运行RANSAC            
	int status = runRansac(Point_sets, n, maxIterations, t, d, best_model, best_consensus_set, best_error);
	//5.输出
	best_model.printLineParam();
	return 0;
}